

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall Assimp::LWOImporter::LoadLWOTags(LWOImporter *this,uint size)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  allocator local_59;
  value_type local_58;
  ulong local_38;
  size_t len;
  char *szEnd;
  char *szLast;
  char *szCur;
  LWOImporter *pLStack_10;
  uint size_local;
  LWOImporter *this_local;
  
  szEnd = (char *)this->mFileBuffer;
  len = (size_t)((uint8_t *)szEnd + size);
  szCur._4_4_ = size;
  pLStack_10 = this;
  for (szLast = szEnd; pcVar1 = szEnd, szLast < len; szLast = szLast + 1) {
    if (*szLast == '\0') {
      uVar2 = (long)szLast - (long)szEnd;
      local_38 = uVar2;
      if (uVar2 != 0) {
        this_00 = this->mTags;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_58,pcVar1,uVar2,&local_59);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_00,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
      iVar3 = 2;
      if ((local_38 & 1) != 0) {
        iVar3 = 1;
      }
      szEnd = szLast + iVar3;
      szLast = szEnd;
    }
  }
  return;
}

Assistant:

void LWOImporter::LoadLWOTags(unsigned int size)
{
    // --- this function is used for both LWO2 and LWOB

    const char* szCur = (const char*)mFileBuffer, *szLast = szCur;
    const char* const szEnd = szLast+size;
    while (szCur < szEnd)
    {
        if (!(*szCur))
        {
            const size_t len = (size_t)(szCur-szLast);
            // FIX: skip empty-sized tags
            if (len)
                mTags->push_back(std::string(szLast,len));
            szCur += (len&0x1 ? 1 : 2);
            szLast = szCur;
        }
        szCur++;
    }
}